

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

optional<const_google::protobuf::Message_*> __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::FindInTypeMap
          (GeneratedMessageFactory *this,Descriptor *type)

{
  iterator *a;
  _Storage<const_google::protobuf::Message_*,_true> _Var1;
  undefined8 uVar2;
  iterator iVar3;
  optional<const_google::protobuf::Message_*> oVar4;
  Descriptor *local_20;
  undefined7 extraout_var;
  
  local_20 = type;
  iVar3 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
          ::find<google::protobuf::Descriptor_const*>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
                      *)&this->type_map_,&local_20);
  a = (iterator *)iVar3.ctrl_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
              *)(this->type_map_).
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  uVar2 = 0;
  _Var1._0_1_ = absl::lts_20250127::container_internal::operator==
                          (a,(iterator *)iVar3.field_1.slot_);
  _Var1._1_7_ = extraout_var;
  if (_Var1._0_1_) {
LAB_002e8c91:
    oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_google::protobuf::Message_*>._8_8_ = uVar2;
    oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload =
         (_Storage<const_google::protobuf::Message_*,_true>)
         (_Storage<const_google::protobuf::Message_*,_true>)_Var1._M_value;
    return (optional<const_google::protobuf::Message_*>)
           oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_google::protobuf::Message_*>;
  }
  if (a == (iterator *)0x0) {
    _GLOBAL__N_1::GeneratedMessageFactory::FindInTypeMap();
  }
  else if (a != (iterator *)(absl::lts_20250127::container_internal::kEmptyGroup + 0x10)) {
    if (-1 < *(char *)&a->ctrl_) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
      ::iterator::operator*(a);
      _Var1 = (_Storage<const_google::protobuf::Message_*,_true>)
              ((_Storage<const_google::protobuf::Message_*,_true> *)((long)iVar3.field_1.slot_ + 8))
              ->_M_value;
      uVar2 = 1;
      goto LAB_002e8c91;
    }
    goto LAB_002e8ca8;
  }
  _GLOBAL__N_1::GeneratedMessageFactory::FindInTypeMap();
LAB_002e8ca8:
  _GLOBAL__N_1::GeneratedMessageFactory::FindInTypeMap();
}

Assistant:

ABSL_SHARED_LOCKS_REQUIRED(mutex_)
  {
    auto it = type_map_.find(type);
    if (it == type_map_.end()) return absl::nullopt;
    return it->second.get();
  }